

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblewidgets.cpp
# Opt level: O0

int __thiscall QAccessibleMdiArea::childCount(QAccessibleMdiArea *this)

{
  long lVar1;
  qsizetype qVar2;
  long in_FS_OFFSET;
  WindowOrder in_stack_ffffffffffffffe4;
  QMdiArea *in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  mdiArea((QAccessibleMdiArea *)0x7e4485);
  QMdiArea::subWindowList(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe4);
  qVar2 = QList<QMdiSubWindow_*>::size((QList<QMdiSubWindow_*> *)&stack0xffffffffffffffe0);
  QList<QMdiSubWindow_*>::~QList((QList<QMdiSubWindow_*> *)0x7e44ae);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (int)qVar2;
  }
  __stack_chk_fail();
}

Assistant:

int QAccessibleMdiArea::childCount() const
{
    return mdiArea()->subWindowList().size();
}